

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::
ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node::Source,_4UL>
::ArrayWithPreallocation
          (ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node::Source,_4UL>
           *this,ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node::Source,_4UL>
                 *other)

{
  Source *pSVar1;
  bool bVar2;
  Source *pSVar3;
  ulong local_20;
  size_t i;
  ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node::Source,_4UL>
  *other_local;
  ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node::Source,_4UL>
  *this_local;
  
  this->numActive = 0;
  this->numAllocated = 4;
  bVar2 = isHeapAllocated(other);
  if (bVar2) {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = other->numAllocated;
    resetToInternalStorage(other);
    other->numActive = 0;
  }
  else {
    pSVar3 = getPreallocatedSpace(this);
    this->items = pSVar3;
    this->numActive = other->numActive;
    for (local_20 = 0; local_20 < this->numActive; local_20 = local_20 + 1) {
      pSVar3 = this->items;
      pSVar1 = other->items;
      pSVar3[local_20].node = pSVar1[local_20].node;
      pSVar3[local_20].connection = pSVar1[local_20].connection;
    }
  }
  return;
}

Assistant:

ArrayWithPreallocation (ArrayWithPreallocation&& other) noexcept
    {
        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            items = getPreallocatedSpace();
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }
    }